

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintCallGraph.cpp
# Opt level: O1

void __thiscall
wasm::PrintCallGraph::run(wasm::Module*)::CallPrinter::CallPrinter(wasm::Module__
          (void *this,Module *module)

{
  pointer puVar1;
  Function *pFVar2;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *import;
  pointer puVar3;
  
  *(undefined8 *)this = 0;
  *(undefined8 *)((long)this + 8) = 0;
  *(undefined8 *)((long)this + 0xb0) = 0;
  *(undefined8 *)((long)this + 0xb8) = 0;
  *(undefined8 *)((long)this + 0xc0) = 0;
  *(undefined8 *)((long)this + 200) = 0;
  *(undefined8 *)((long)this + 0xd0) = 0;
  *(Module **)((long)this + 0xd8) = module;
  *(undefined4 *)((long)this + 0xf0) = 0;
  *(undefined8 *)((long)this + 0xf8) = 0;
  *(long *)((long)this + 0x100) = (long)this + 0xf0;
  *(long *)((long)this + 0x108) = (long)this + 0xf0;
  *(undefined8 *)((long)this + 0x110) = 0;
  *(undefined8 *)((long)this + 0x118) = 0;
  *(undefined8 *)((long)this + 0x120) = 0;
  *(undefined8 *)((long)this + 0x128) = 0;
  puVar3 = (module->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (module->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar3 != puVar1) {
    do {
      pFVar2 = (puVar3->_M_t).
               super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
               super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
      if (*(char **)((long)&(pFVar2->super_Importable).module.super_IString + 8) == (char *)0x0) {
        *(Function **)((long)this + 0xe0) = pFVar2;
        std::
        _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
        ::clear((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                 *)((long)this + 0xe8));
        Walker<CallPrinter,_wasm::Visitor<CallPrinter,_void>_>::walk
                  ((Walker<CallPrinter,_wasm::Visitor<CallPrinter,_void>_> *)this,&pFVar2->body);
      }
      puVar3 = puVar3 + 1;
    } while (puVar3 != puVar1);
  }
  return;
}

Assistant:

CallPrinter(Module* module) : module(module) {
        // Walk function bodies.
        ModuleUtils::iterDefinedFunctions(*module, [&](Function* curr) {
          currFunction = curr;
          visitedTargets.clear();
          walk(curr->body);
        });
      }